

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalTree.h
# Opt level: O3

void __thiscall
IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>::IntervalTree
          (IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long> *this,intervalTree *other)

{
  std::
  vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  ::vector(&this->intervals,&other->intervals);
  if ((other->left)._M_t.
      super___uniq_ptr_impl<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
      .super__Head_base<0UL,_IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_false>.
      _M_head_impl == (IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long> *)0x0) {
    (this->left)._M_t.
    super___uniq_ptr_impl<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
    .super__Head_base<0UL,_IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_false>.
    _M_head_impl = (IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long> *)0x0;
  }
  else {
    copyTree((IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long> *)&this->left,this);
  }
  if ((other->right)._M_t.
      super___uniq_ptr_impl<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
      .super__Head_base<0UL,_IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_false>.
      _M_head_impl == (IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long> *)0x0) {
    (this->right)._M_t.
    super___uniq_ptr_impl<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
    .super__Head_base<0UL,_IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_*,_false>.
    _M_head_impl = (IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long> *)0x0;
  }
  else {
    copyTree((IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long> *)&this->right,this);
  }
  this->center = other->center;
  return;
}

Assistant:

IntervalTree<T,K>(const intervalTree& other)
    :   intervals(other.intervals),
        left(other.left ? copyTree(*other.left) : nullptr),
        right(other.right ? copyTree(*other.right) : nullptr),
        center(other.center)
    {
    }